

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiColorMod *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ImVec2 in_RAX;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  long lVar22;
  char *pcVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ImVec2 local_38;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  bVar11 = window->WasActive;
  uVar14 = (uint)(GImGui->NavWindow == window);
  local_38 = in_RAX;
  if (bVar11 == false) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
    bVar9 = TreeNodeEx(label,uVar14,"%s \'%s\'%s",label,window->Name," *Inactive*");
    pIVar8 = GImGui;
    lVar22 = (long)(GImGui->ColorStack).Size;
    pIVar7 = (GImGui->ColorStack).Data;
    pIVar1 = &pIVar7[lVar22 + -1].BackupValue;
    fVar3 = pIVar1->y;
    fVar4 = pIVar1->z;
    fVar5 = pIVar1->w;
    pIVar2 = (GImGui->Style).Colors + pIVar7[lVar22 + -1].Col;
    pIVar2->x = pIVar1->x;
    pIVar2->y = fVar3;
    pIVar2->z = fVar4;
    pIVar2->w = fVar5;
    (pIVar8->ColorStack).Size = (pIVar8->ColorStack).Size + -1;
  }
  else {
    bVar9 = TreeNodeEx(label,uVar14,"%s \'%s\'%s",label,window->Name,"");
    bVar10 = IsItemHovered(0);
    if ((bVar10 & bVar11) == 1) {
      local_38.x = (window->Size).x + (window->Pos).x;
      local_38.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(&GImGui->ForegroundDrawList,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0)
      ;
    }
  }
  if (!bVar9) {
    return;
  }
  if (window->MemoryCompacted == true) {
    TextDisabled("Note: some memory buffers have been compacted/freed.");
  }
  uVar14 = window->Flags;
  DebugNodeDrawList(window,window->DrawList,"DrawList");
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",(double)(window->Pos).x,
             (double)(window->Pos).y,(double)(window->Size).x,(double)(window->Size).y,
             (double)(window->ContentSize).x,(double)(window->ContentSize).y);
  pcVar13 = "Child ";
  if ((uVar14 >> 0x18 & 1) == 0) {
    pcVar13 = "";
  }
  auVar26._0_4_ = -(uint)((uVar14 & 0x10000000) == 0);
  auVar26._4_4_ = -(uint)((uVar14 & 0x8000000) == 0);
  auVar26._8_4_ = -(uint)((uVar14 & 0x4000000) == 0);
  auVar26._12_4_ = -(uint)((uVar14 & 0x2000000) == 0);
  auVar25._0_4_ = -(uint)((uVar14 & 0x40) == 0);
  auVar25._4_4_ = -(uint)((uVar14 & 0x40000) == 0);
  auVar25._8_4_ = -(uint)((uVar14 & 0x200) == 0);
  auVar25._12_4_ = -(uint)((uVar14 & 0x100) == 0);
  auVar26 = packssdw(auVar25,auVar26);
  auVar26 = packsswb(auVar26,auVar26);
  pcVar12 = "Tooltip ";
  if ((auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar12 = "";
  }
  pcVar15 = "Popup ";
  if ((auVar26 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar15 = "";
  }
  pcVar17 = "Modal ";
  if ((auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar17 = "";
  }
  pcVar18 = "ChildMenu ";
  if ((auVar26 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar18 = "";
  }
  pcVar19 = "NoSavedSettings ";
  if ((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar19 = "";
  }
  pcVar23 = "NoMouseInputs";
  if ((auVar26 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar23 = "";
  }
  pcVar20 = "NoNavInputs";
  if ((auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar20 = "";
  }
  pcVar21 = "AlwaysAutoResize";
  if ((auVar26 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar21 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar14,pcVar13,pcVar12,pcVar15,pcVar17,
             pcVar18,pcVar19,pcVar23,pcVar20,pcVar21);
  pcVar13 = "X";
  if (window->ScrollbarX == false) {
    pcVar13 = "";
  }
  pcVar12 = "Y";
  if (window->ScrollbarY == false) {
    pcVar12 = "";
  }
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
             (double)(window->ScrollMax).x,(double)(window->Scroll).y,(double)(window->ScrollMax).y,
             pcVar13,pcVar12);
  if ((window->Active != false) || (uVar16 = 0xffffffff, window->WasActive != false)) {
    uVar16 = (ulong)(uint)(int)window->BeginOrderWithinContext;
  }
  BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active,
             (ulong)window->WasActive,(ulong)window->WriteAccessed,uVar16);
  BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
             (ulong)window->Appearing,(ulong)window->Hidden,
             (ulong)(uint)window->HiddenFramesCanSkipItems,
             (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar13 = "NULL";
  }
  else {
    pcVar13 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar13);
  fVar3 = window->NavRectRel[0].Min.x;
  fVar4 = window->NavRectRel[0].Max.x;
  if (fVar3 <= fVar4) {
    fVar5 = window->NavRectRel[0].Min.y;
    fVar6 = window->NavRectRel[0].Max.y;
    if (fVar5 <= fVar6) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar3,(double)fVar5,(double)fVar4,
                 (double)fVar6);
      goto LAB_001306e8;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_001306e8:
  if (window->RootWindow != window) {
    DebugNodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    DebugNodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
  }
  if ((0 < (window->ColumnsStorage).Size) &&
     (bVar11 = TreeNode("Columns","Columns sets (%d)"), bVar11)) {
    if (0 < (window->ColumnsStorage).Size) {
      lVar22 = 0;
      lVar24 = 0;
      do {
        DebugNodeColumns((ImGuiOldColumns *)((long)&((window->ColumnsStorage).Data)->ID + lVar22));
        lVar24 = lVar24 + 1;
        lVar22 = lVar22 + 0x88;
      } while (lVar24 < (window->ColumnsStorage).Size);
    }
    TreePop();
  }
  DebugNodeStorage(&window->StateStorage,"Storage");
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
    BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (!window->NavRectRel[0].IsInverted())
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
    else
        BulletText("NavRectRel[0]: <None>");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}